

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_tvptr(ASMState *as,Reg dest,IRRef ref,MSize mode)

{
  Reg RVar1;
  int iVar2;
  undefined4 local_38;
  Reg src;
  TValue k;
  IRIns *ir;
  IRRef local_20;
  MSize mode_local;
  IRRef ref_local;
  Reg dest_local;
  ASMState *as_local;
  
  ir._4_4_ = mode;
  local_20 = ref;
  mode_local = dest;
  _ref_local = as;
  if ((mode & 1) != 0) {
    k.u64 = (uint64_t)(as->ir + ref);
    if ((((IRType1 *)(k.u64 + 4))->irt & 0x1f) == 0xe) {
      if ((ref < 0x8000) && ((mode & 2) == 0)) {
        emit_loadu64(as,dest,(uint64_t)(k.u64 + 8));
        return;
      }
      RVar1 = ra_alloc1(as,ref,0xffff0000);
      emit_rmro(as,XO_MOVSDto,RVar1,mode_local,0);
    }
    else if (ref < 0x8000) {
      lj_ir_kvalue(as->J->L,(TValue *)&stack0xffffffffffffffc8,(IRIns *)k);
      emit_movmroi(_ref_local,mode_local,4,src);
      emit_movmroi(_ref_local,mode_local,0,local_38);
    }
    else {
      RVar1 = ra_alloc1(as,ref,(1 << ((byte)dest & 0x1f) ^ 0xffffffffU) & 0xbfef);
      if ((0x605fd9U >> (*(byte *)(k.u64 + 4) & 0x1f) & 1) == 0) {
        as_local._0_4_ = *(byte *)(k.u64 + 4) & 0x1f;
        emit_movmroi(_ref_local,mode_local,4,((uint)as_local ^ 0xffffffff) << 0xf);
      }
      else {
        as_local._4_4_ = *(byte *)(k.u64 + 4) & 0x1f;
        *(uint *)(_ref_local->mcp + -4) = (as_local._4_4_ ^ 0xffffffff) << 0xf;
        _ref_local->mcp = _ref_local->mcp + -4;
        emit_rmro(_ref_local,XO_ARITHi,1,mode_local,4);
      }
      iVar2 = 0;
      if ((0x605fd9U >> (*(byte *)(k.u64 + 4) & 0x1f) & 1) != 0) {
        iVar2 = 0x80200;
      }
      emit_rmro(_ref_local,XO_MOVto,RVar1 + iVar2,mode_local,0);
    }
  }
  emit_loadu64(_ref_local,mode_local,(uint64_t)(_ref_local->J[-1].penalty + 0x33));
  return;
}

Assistant:

static void asm_tvptr(ASMState *as, Reg dest, IRRef ref, MSize mode)
{
  if ((mode & IRTMPREF_IN1)) {
    IRIns *ir = IR(ref);
    if (irt_isnum(ir->t)) {
      if (irref_isk(ref) && !(mode & IRTMPREF_OUT1)) {
	/* Use the number constant itself as a TValue. */
	emit_loada(as, dest, ir_knum(ir));
	return;
      }
      emit_rmro(as, XO_MOVSDto, ra_alloc1(as, ref, RSET_FPR), dest, 0);
    } else {
#if LJ_GC64
      if (irref_isk(ref)) {
	TValue k;
	lj_ir_kvalue(as->J->L, &k, ir);
	emit_movmroi(as, dest, 4, k.u32.hi);
	emit_movmroi(as, dest, 0, k.u32.lo);
      } else {
	/* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	if (irt_is64(ir->t)) {
	  emit_u32(as, irt_toitype(ir->t) << 15);
	  emit_rmro(as, XO_ARITHi, XOg_OR, dest, 4);
	} else {
	  emit_movmroi(as, dest, 4, (irt_toitype(ir->t) << 15));
	}
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      }
#else
      if (!irref_isk(ref)) {
	Reg src = ra_alloc1(as, ref, rset_exclude(RSET_GPR, dest));
	emit_movtomro(as, REX_64IR(ir, src), dest, 0);
      } else if (!irt_ispri(ir->t)) {
	emit_movmroi(as, dest, 0, ir->i);
      }
      if (!(LJ_64 && irt_islightud(ir->t)))
	emit_movmroi(as, dest, 4, irt_toitype(ir->t));
#endif
    }
  }
  emit_loada(as, dest, &J2G(as->J)->tmptv); /* g->tmptv holds the TValue(s). */
}